

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QItemSelectionRange *range)

{
  long lVar1;
  QPersistentModelIndexData *pQVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QPersistentModelIndex local_48;
  QDebug local_40;
  QPersistentModelIndex local_38;
  QDebug local_30;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)range);
  *(undefined1 *)&(range->tl).d[1].index.m.ptr = 0;
  pQVar3 = QDebug::operator<<((QDebug *)range,"QItemSelectionRange(");
  local_48.d = (QPersistentModelIndexData *)pQVar3->stream;
  ((Stream *)local_48.d)->ref = ((Stream *)local_48.d)->ref + 1;
  operator<<((Stream *)&local_40,&local_48);
  pQVar3 = QDebug::operator<<(&local_40,',');
  local_38.d = (QPersistentModelIndexData *)pQVar3->stream;
  ((Stream *)local_38.d)->ref = ((Stream *)local_38.d)->ref + 1;
  operator<<((Stream *)&local_30,&local_38);
  QDebug::operator<<(&local_30,')');
  QDebug::~QDebug(&local_30);
  QDebug::~QDebug((QDebug *)&local_38);
  QDebug::~QDebug(&local_40);
  QDebug::~QDebug((QDebug *)&local_48);
  pQVar2 = (range->tl).d;
  (range->tl).d = (QPersistentModelIndexData *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QItemSelectionRange &range)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QItemSelectionRange(" << range.topLeft()
                  << ',' << range.bottomRight() << ')';
    return dbg;
}